

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O0

void __thiscall wabt::BinaryReaderLogging::LogType(BinaryReaderLogging *this,Type type)

{
  Stream *pSVar1;
  bool bVar2;
  Index IVar3;
  undefined8 uVar4;
  string local_38;
  BinaryReaderLogging *local_18;
  BinaryReaderLogging *this_local;
  Type type_local;
  
  local_18 = this;
  this_local = (BinaryReaderLogging *)type;
  bVar2 = Type::IsIndex((Type *)&this_local);
  if (bVar2) {
    pSVar1 = this->stream_;
    IVar3 = Type::GetIndex((Type *)&this_local);
    Stream::Writef(pSVar1,"typeidx[%d]",(ulong)IVar3);
  }
  else {
    pSVar1 = this->stream_;
    Type::GetName_abi_cxx11_(&local_38,(Type *)&this_local);
    uVar4 = std::__cxx11::string::c_str();
    Stream::Writef(pSVar1,"%s",uVar4);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void BinaryReaderLogging::LogType(Type type) {
  if (type.IsIndex()) {
    LOGF_NOINDENT("typeidx[%d]", type.GetIndex());
  } else {
    LOGF_NOINDENT("%s", type.GetName().c_str());
  }
}